

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderingUtils.hpp
# Opt level: O3

void __thiscall
Kernel::MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~MultiSet
          (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this)

{
  __mpz_struct *p_Var1;
  ulong uVar2;
  __mpz_struct *r;
  
  r = (__mpz_struct *)(this->_elems)._cursor;
  while (p_Var1 = (__mpz_struct *)(this->_elems)._stack, r != p_Var1) {
    mpz_clear(r + -2);
    mpz_clear(r + -3);
    r = r + -4;
    mpz_clear(r);
  }
  if (r != (__mpz_struct *)0x0) {
    uVar2 = (this->_elems)._capacity << 6;
    if (uVar2 == 0) {
      p_Var1->_mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      p_Var1->_mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = p_Var1;
    }
    else {
      if (0x40 < uVar2) {
        operator_delete(p_Var1,0x10);
        return;
      }
      p_Var1->_mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      p_Var1->_mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = p_Var1;
    }
  }
  return;
}

Assistant:

void integrity() const {
#if VDEBUG
      ASS(std::is_sorted(_elems.begin(), _elems.end(), [](auto l, auto r) { return std::get<0>(l) < std::get<0>(r); }))
      for (auto e : _elems) {
        ASS_G(std::get<1>(e), IntegerConstantType(0))
      }
#endif
    }